

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.h
# Opt level: O2

bool __thiscall QSimplexConstraint::isSatisfied(QSimplexConstraint *this)

{
  double dVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  double dVar7;
  double local_30;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (piter)QHash<QSimplexVariable_*,_double>::cbegin(&this->variables);
  local_30 = 0.0;
  while( true ) {
    if (local_28.d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0 &&
        local_28.bucket == 0) break;
    pSVar3 = (local_28.d)->spans;
    uVar5 = local_28.bucket >> 7;
    pEVar4 = pSVar3[uVar5].entries;
    bVar2 = pSVar3[uVar5].offsets[(uint)local_28.bucket & 0x7f];
    local_30 = local_30 +
               *(double *)(pEVar4[bVar2].storage.data + 8) * **(double **)pEVar4[bVar2].storage.data
    ;
    QHashPrivate::iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_>::operator++(&local_28);
  }
  dVar1 = this->constant;
  bVar6 = true;
  if (((local_30 != dVar1) || (NAN(local_30) || NAN(dVar1))) &&
     (dVar7 = local_30 - dVar1, uVar5 = -(ulong)(dVar7 < -dVar7),
     1e-07 <= (double)(~uVar5 & (ulong)dVar7 | (ulong)-dVar7 & uVar5))) {
    if (this->ratio == MoreOrEqual) {
      bVar6 = local_30 < dVar1;
    }
    else {
      if (this->ratio != LessOrEqual) {
        bVar6 = false;
        goto LAB_005cd38a;
      }
      bVar6 = dVar1 < local_30;
    }
    bVar6 = !bVar6 && dVar1 != local_30;
  }
LAB_005cd38a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool isSatisfied() {
        qreal leftHandSide(0);

        for (auto iter = variables.cbegin(); iter != variables.cend(); ++iter) {
            leftHandSide += iter.value() * iter.key()->result;
        }

        Q_ASSERT(constant > 0 || qFuzzyCompare(1, 1 + constant));

        if ((leftHandSide == constant) || qAbs(leftHandSide - constant) < 0.0000001)
            return true;

        switch (ratio) {
        case LessOrEqual:
            return leftHandSide < constant;
        case MoreOrEqual:
            return leftHandSide > constant;
        default:
            return false;
        }
    }